

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

char * ParsePast(char *token,char *s)

{
  char cVar1;
  char cVar2;
  char *local_20;
  char *s_local;
  char *token_local;
  
  if ((((token != (char *)0x0) && (' ' < *token)) &&
      (local_20 = ParsePastWhiteSpace(s), local_20 != (char *)0x0)) &&
     (s_local = token, ' ' < *local_20)) {
    while( true ) {
      cVar1 = ToUpper(*local_20);
      cVar2 = ToUpper(*s_local);
      if (cVar1 != cVar2) break;
      if (*local_20 == '\0') {
        return local_20;
      }
      local_20 = local_20 + 1;
      s_local = s_local + 1;
    }
  }
  return (char *)0x0;
}

Assistant:

static const char* ParsePast(const char* token, const char* s)
{
  if (0 == token || token[0] <= 32)
    return 0;

  s = ParsePastWhiteSpace(s);
  if (0 == s || s[0] <= 32)
    return 0;

  for (/*empty init*/; ToUpper(*s) == ToUpper(*token); s++, token++)
  {
    if (0 == *s)
      return s;
  }
  return 0;
}